

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void despot::logging::stream(int level,ostream *out)

{
  ostream *out_00;
  log_ostream *this;
  reference pplVar1;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  int level_local;
  
  if ((0 < level) && (level < 6)) {
    local_18 = out;
    out_local._4_4_ = level;
    this = (log_ostream *)operator_new(0x1a0);
    out_00 = local_18;
    std::__cxx11::string::string
              ((string *)&local_38,(string *)(markers__abi_cxx11_ + (long)out_local._4_4_ * 0x20));
    log_ostream::log_ostream(this,out_00,&local_38);
    pplVar1 = std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::operator[]
                        ((vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *)
                         streams_,(long)out_local._4_4_);
    *pplVar1 = this;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void logging::stream(int level, ostream& out) {
	if (level >= ERROR && level <= VERBOSE) {
		streams_[level] = new log_ostream(out, markers_[level]);
	}
}